

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

FT_Error ps_mask_ensure(PS_Mask mask,FT_UInt count,FT_Memory memory)

{
  FT_Error FVar1;
  FT_Byte *pFVar2;
  uint uVar3;
  uint uVar4;
  FT_Error error;
  
  uVar3 = mask->max_bits >> 3;
  error = 0;
  uVar4 = count + 7 >> 3;
  FVar1 = 0;
  if (uVar3 < uVar4) {
    uVar4 = uVar4 + 7 & 0xfffffff8;
    pFVar2 = (FT_Byte *)ft_mem_realloc(memory,1,(ulong)uVar3,(ulong)uVar4,mask->bytes,&error);
    mask->bytes = pFVar2;
    FVar1 = error;
    if (error == 0) {
      mask->max_bits = uVar4 << 3;
      FVar1 = 0;
    }
  }
  return FVar1;
}

Assistant:

static FT_Error
  ps_mask_ensure( PS_Mask    mask,
                  FT_UInt    count,
                  FT_Memory  memory )
  {
    FT_UInt   old_max = mask->max_bits >> 3;
    FT_UInt   new_max = ( count + 7 ) >> 3;
    FT_Error  error   = FT_Err_Ok;


    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 8 );
      /* added bytes are zeroed here */
      if ( !FT_RENEW_ARRAY( mask->bytes, old_max, new_max ) )
        mask->max_bits = new_max * 8;
    }
    return error;
  }